

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

dsListEntry * dsListAdd(dsList *list,void *data)

{
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t dataOffset;
  uint64_t listEntryOffset;
  dsListEntry *next;
  dsListEntry *entry;
  void *data_local;
  dsList *list_local;
  
  if (list == (dsList *)0x0) {
    dsRunLogCallback("%s(): Bad argument: %p\n","dsListAdd",0);
    list_local = (dsList *)0x0;
  }
  else {
    list_local = (dsList *)dsAlloc(0x20);
    if (list_local == (dsList *)0x0) {
      dsRunLogCallback("%s(): Can\'t allocate list entry object.\n","dsListAdd");
      list_local = (dsList *)0x0;
    }
    else {
      uVar2 = dsOffset(list_local);
      uVar3 = dsOffset(data);
      dsRunLogCallback("%s(): listEntryOffset: %lu, dataOffset: %lu\n","dsListAdd",uVar2,uVar3);
      listEntryOffset = 0;
      if ((list->headOffset == 0xffffffffffffffff) ||
         (listEntryOffset = (uint64_t)dsPtr(list->headOffset,0x20),
         (void *)listEntryOffset != (void *)0x0)) {
        list_local->magic = 0x79746e457473696c;
        list_local[1].magic = uVar3;
        list_local->count = 0xffffffffffffffff;
        list_local->headOffset = list->headOffset;
        if (listEntryOffset != 0) {
          *(uint64_t *)(listEntryOffset + 8) = uVar2;
        }
        list->headOffset = uVar2;
        list->count = list->count + 1;
      }
      else {
        dsRunLogCallback("%s(): Can\'t map list next offset.\n","dsListAdd");
        iVar1 = dsFree(list_local);
        if (iVar1 < 0) {
          dsRunLogCallback("%s(): Can\'t free list entry object.\n","dsListAdd");
        }
        list_local = (dsList *)0x0;
      }
    }
  }
  return (dsListEntry *)list_local;
}

Assistant:

dsListEntry *
dsListAdd(dsList *list, void *data)
{
	dsListEntry *entry;
	dsListEntry *next;
	uint64_t listEntryOffset;
	uint64_t dataOffset;

	if (list == NULL) {
		dsLog("Bad argument: %p\n", list);
		return(NULL);
	}

	if ((entry = dsAlloc(sizeof(*entry))) == NULL) {
		dsLog("Can't allocate list entry object.\n");
		return(NULL);
	}

	listEntryOffset = dsOffset(entry);
	dataOffset = dsOffset(data);

	dsLog("listEntryOffset: %" PRIu64 ", dataOffset: %" PRIu64 "\n",\
		  listEntryOffset, dataOffset);

	/*
	 * Found the entry to remove.
	 */
	next = NULL;
	if (list->headOffset != UINT64_MAX) {
		if ((next = dsPtr(list->headOffset, sizeof(*next))) == NULL) {
			dsLog("Can't map list next offset.\n");
			if (dsFree(entry) < 0) {
				dsLog("Can't free list entry object.\n");
			}
			return(NULL);
		}
	}

	entry->magic = MAGIC_LISTENTRY;
	entry->dataOffset = dataOffset;
	entry->prevOffset = UINT64_MAX;
	entry->nextOffset = list->headOffset;
	if (next != NULL) {
		next->prevOffset = listEntryOffset;
	}
	list->headOffset = listEntryOffset;
	list->count++;

	return(entry);
}